

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void leftRightProcessMemoryTemps
               (AssemblyCommands *newAssemblyCommands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *spilledToOffset,CTemp *beginSP,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared
               ,CTemp *leftOperand,CTemp *rightOperand,bool shouldLoadLeft,bool shouldStoreLeft)

{
  iterator iVar1;
  iterator iVar2;
  _Rb_tree_header *p_Var3;
  CTemp rightTemp;
  string local_98;
  shared_ptr<AssemblyCode::AssemblyCommand> *local_78;
  string rightName;
  string leftName;
  
  local_78 = thisShared;
  if (shouldLoadLeft || shouldStoreLeft) {
    IRT::CTemp::ToString_abi_cxx11_(&leftName,leftOperand);
    IRT::CTemp::ToString_abi_cxx11_(&rightName,rightOperand);
    IRT::CTemp::ToString_abi_cxx11_(&rightTemp.name,leftOperand);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&spilledToOffset->_M_t,&rightTemp.name);
    std::__cxx11::string::~string((string *)&rightTemp);
    IRT::CTemp::ToString_abi_cxx11_(&rightTemp.name,rightOperand);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&spilledToOffset->_M_t,&rightTemp.name);
    std::__cxx11::string::~string((string *)&rightTemp);
    p_Var3 = &(spilledToOffset->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar2._M_node != p_Var3) {
      IRT::CTemp::CTemp(&rightTemp);
      createLoad((CTemp *)&local_98,(int)&rightTemp,(CTemp *)(ulong)iVar2._M_node[2]._M_color);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)newAssemblyCommands,(shared_ptr<AssemblyCode::AssemblyCommand> *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
      IRT::CTemp::ToString_abi_cxx11_(&local_98,&rightTemp);
      std::__cxx11::string::operator=((string *)&rightName,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&rightTemp);
    }
    if ((_Rb_tree_header *)iVar1._M_node == p_Var3) {
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,local_78);
    }
    else {
      IRT::CTemp::CTemp(&rightTemp);
      if (shouldLoadLeft) {
        createLoad((CTemp *)&local_98,(int)&rightTemp,(CTemp *)(ulong)iVar1._M_node[2]._M_color);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)newAssemblyCommands,(shared_ptr<AssemblyCode::AssemblyCommand> *)&local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
      }
      IRT::CTemp::ToString_abi_cxx11_(&local_98,&rightTemp);
      std::__cxx11::string::operator=((string *)&leftName,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,local_78);
      if (shouldStoreLeft) {
        createStore((CTemp *)&local_98,(int)&rightTemp,(CTemp *)(ulong)iVar1._M_node[2]._M_color);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)newAssemblyCommands,(shared_ptr<AssemblyCode::AssemblyCommand> *)&local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
      }
      std::__cxx11::string::~string((string *)&rightTemp);
    }
    IRT::CTemp::setName(leftOperand,&leftName);
    IRT::CTemp::setName(rightOperand,&rightName);
    std::__cxx11::string::~string((string *)&rightName);
    std::__cxx11::string::~string((string *)&leftName);
    return;
  }
  __assert_fail("shouldLoadLeft || shouldStoreLeft",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/AssemblyCommand.cpp"
                ,0x1a,
                "void leftRightProcessMemoryTemps(AssemblyCommands &, std::map<std::string, int> &, IRT::CTemp &, std::shared_ptr<AssemblyCode::AssemblyCommand>, IRT::CTemp &, IRT::CTemp &, bool, bool)"
               );
}

Assistant:

void leftRightProcessMemoryTemps(AssemblyCommands &newAssemblyCommands,
                                 std::map<std::string, int> &spilledToOffset,
                                 IRT::CTemp& beginSP,
                                 std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                 IRT::CTemp& leftOperand,
                                 IRT::CTemp& rightOperand,
                                 bool shouldLoadLeft = true,
                                 bool shouldStoreLeft = true) {

    assert(shouldLoadLeft || shouldStoreLeft);

    std::string leftName = leftOperand.ToString();
    std::string rightName = rightOperand.ToString();

    auto leftFind = spilledToOffset.find(leftOperand.ToString());
    auto rightFind = spilledToOffset.find(rightOperand.ToString());

    if (rightFind != spilledToOffset.end()) {
        IRT::CTemp rightTemp;
        newAssemblyCommands.push_back(createLoad(rightTemp, rightFind->second, beginSP));

        rightName = rightTemp.ToString();
    }

    if (leftFind != spilledToOffset.end()) {
        IRT::CTemp leftTemp;
        if (shouldLoadLeft) {
            newAssemblyCommands.push_back( createLoad( leftTemp, leftFind->second, beginSP ));
        }
        leftName = leftTemp.ToString( );

        newAssemblyCommands.push_back(thisShared);

        if (shouldStoreLeft) {
            newAssemblyCommands.push_back( createStore( leftTemp, leftFind->second, beginSP ));
        }
    } else {
        newAssemblyCommands.push_back(thisShared);
    }

    leftOperand.setName(leftName);
    rightOperand.setName(rightName);
}